

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  ssize_t sVar1;
  int *piVar2;
  allocator local_11e;
  char status_ch;
  int local_11c;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  status_ch = 'L';
  if (reason != TEST_DID_NOT_DIE) {
    status_ch = (reason == TEST_THREW_EXCEPTION) * '\x02' + 'R';
  }
  do {
    sVar1 = write(this->write_fd_,&status_ch,1);
    if ((int)sVar1 != -1) goto LAB_00138bd9;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  std::__cxx11::string::string((string *)&local_38,"CHECK failed: File ",&local_11e);
  std::operator+(&local_f8,&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/googletest/src/googletest_project/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_d8,&local_f8,", line ");
  local_11c = 0x1f9;
  StreamableToString<int>(&local_118,&local_11c);
  std::operator+(&local_b8,&local_d8,&local_118);
  std::operator+(&local_98,&local_b8,": ");
  std::operator+(&local_78,&local_98,"posix::Write(write_fd(), &status_ch, 1)");
  std::operator+(&local_58,&local_78," != -1");
  DeathTestAbort(&local_58);
LAB_00138bd9:
  _exit(1);
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch =
      reason == TEST_DID_NOT_DIE ? kDeathTestLived :
      reason == TEST_THREW_EXCEPTION ? kDeathTestThrew : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}